

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_boolean_with_string(void)

{
  error *ex_7;
  undefined1 local_3eb;
  undefined1 local_3ea [2];
  undefined1 local_3e8 [8];
  variable data_7;
  error *ex_6;
  undefined1 local_378 [8];
  variable data_6;
  error *ex_5;
  undefined1 local_2db;
  undefined1 local_2da [2];
  undefined1 local_2d8 [8];
  variable data_5;
  error *ex_4;
  undefined1 local_268 [8];
  variable data_4;
  error *ex_3;
  undefined1 local_1cb;
  undefined1 local_1ca [2];
  undefined1 local_1c8 [8];
  variable data_3;
  error *ex_2;
  undefined1 local_158 [8];
  variable data_2;
  error *ex_1;
  undefined1 local_bb;
  undefined1 local_ba [2];
  undefined1 local_b8 [8];
  variable data_1;
  error *ex;
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,false);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x198,"void append_suite::append_boolean_with_string()",local_3a,&local_3b);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,"alpha");
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(\"alpha\")","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x19b,"void append_suite::append_boolean_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_b8,false);
  local_ba[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_b8);
  local_bb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x19f,"void append_suite::append_boolean_with_string()",local_ba,&local_bb);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_b8,
             (basic_variable<std::allocator<char>_> *)&ex_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(\"alpha\"))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1a2,"void append_suite::append_boolean_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_158,false);
  ex_2._6_1_ = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                         ((basic_variable<std::allocator<char>_> *)local_158);
  ex_2._5_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1a7,"void append_suite::append_boolean_with_string()",(long)&ex_2 + 6,
             (long)&ex_2 + 5);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_158,L"bravo");
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(L\"bravo\")","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1aa,"void append_suite::append_boolean_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_1c8,false);
  local_1ca[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_1c8);
  local_1cb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1ae,"void append_suite::append_boolean_with_string()",local_1ca,&local_1cb);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_3,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_1c8,
             (basic_variable<std::allocator<char>_> *)&ex_3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_3);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(L\"bravo\"))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1b1,"void append_suite::append_boolean_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_268,false);
  ex_4._6_1_ = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                         ((basic_variable<std::allocator<char>_> *)local_268);
  ex_4._5_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1b6,"void append_suite::append_boolean_with_string()",(long)&ex_4 + 6,
             (long)&ex_4 + 5);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_268,L"charlie");
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(u\"charlie\")","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1b9,"void append_suite::append_boolean_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_2d8,false);
  local_2da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_2d8);
  local_2db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1bd,"void append_suite::append_boolean_with_string()",local_2da,&local_2db);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_5,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_2d8,
             (basic_variable<std::allocator<char>_> *)&ex_5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_5);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(u\"charlie\"))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1c0,"void append_suite::append_boolean_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_378,false);
  ex_6._6_1_ = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                         ((basic_variable<std::allocator<char>_> *)local_378);
  ex_6._5_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1c5,"void append_suite::append_boolean_with_string()",(long)&ex_6 + 6,
             (long)&ex_6 + 5);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_378,L"delta");
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(U\"delta\")","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1c8,"void append_suite::append_boolean_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_3e8,false);
  local_3ea[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_3e8);
  local_3eb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1cc,"void append_suite::append_boolean_with_string()",local_3ea,&local_3eb);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_7,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_3e8,
             (basic_variable<std::allocator<char>_> *)&ex_7);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_7);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(U\"delta\"))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1cf,"void append_suite::append_boolean_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3e8);
  return;
}

Assistant:

void append_boolean_with_string()
{
    // boolean - string
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=("alpha"),
                                        error,
                                        "incompatible type");
    }
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable("alpha")),
                                        error,
                                        "incompatible type");
    }
    // boolean - wstring
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(L"bravo"),
                                        error,
                                        "incompatible type");
    }
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(L"bravo")),
                                        error,
                                        "incompatible type");
    }
    // boolean - u16string
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(u"charlie"),
                                        error,
                                        "incompatible type");
    }
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(u"charlie")),
                                        error,
                                        "incompatible type");
    }
    // boolean - u32string
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(U"delta"),
                                        error,
                                        "incompatible type");
    }
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(U"delta")),
                                        error,
                                        "incompatible type");
    }
}